

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssim.c
# Opt level: O1

void VP8SSIMDspInit(void)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&VP8SSIMDspInit::VP8SSIMDspInit_body_lock);
  if (iVar1 != 0) {
    return;
  }
  if (VP8SSIMDspInit::VP8SSIMDspInit_body_last_cpuinfo_used != VP8GetCPUInfo) {
    VP8SSIMGetClipped = SSIMGetClipped_C;
    VP8SSIMGet = SSIMGet_C;
    VP8AccumulateSSE = AccumulateSSE_C;
    if (VP8GetCPUInfo != (VP8CPUInfo)0x0) {
      iVar1 = (*VP8GetCPUInfo)(kSSE2);
      if (iVar1 != 0) {
        VP8SSIMDspInitSSE2();
      }
    }
  }
  VP8SSIMDspInit::VP8SSIMDspInit_body_last_cpuinfo_used = VP8GetCPUInfo;
  pthread_mutex_unlock((pthread_mutex_t *)&VP8SSIMDspInit::VP8SSIMDspInit_body_lock);
  return;
}

Assistant:

WEBP_DSP_INIT_FUNC(VP8SSIMDspInit) {
#if !defined(WEBP_REDUCE_SIZE)
  VP8SSIMGetClipped = SSIMGetClipped_C;
  VP8SSIMGet = SSIMGet_C;
#endif

#if !defined(WEBP_DISABLE_STATS)
  VP8AccumulateSSE = AccumulateSSE_C;
#endif

  if (VP8GetCPUInfo != NULL) {
#if defined(WEBP_HAVE_SSE2)
    if (VP8GetCPUInfo(kSSE2)) {
      VP8SSIMDspInitSSE2();
    }
#endif
  }
}